

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

OrderCancelRequest * __thiscall
Application::queryOrderCancelRequest41(OrderCancelRequest *__return_storage_ptr__,Application *this)

{
  Header *header;
  OrderQty local_1e8;
  Side local_190;
  Symbol local_138;
  ClOrdID local_d0;
  OrigClOrdID local_78;
  undefined1 local_19;
  Application *local_18;
  Application *this_local;
  OrderCancelRequest *orderCancelRequest;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Application *)__return_storage_ptr__;
  queryOrigClOrdID(&local_78,this);
  queryClOrdID(&local_d0,this);
  querySymbol(&local_138,this);
  querySide(&local_190,this);
  FIX41::OrderCancelRequest::OrderCancelRequest
            (__return_storage_ptr__,&local_78,&local_d0,&local_138,&local_190);
  FIX::Side::~Side(&local_190);
  FIX::Symbol::~Symbol(&local_138);
  FIX::ClOrdID::~ClOrdID(&local_d0);
  FIX::OrigClOrdID::~OrigClOrdID(&local_78);
  queryOrderQty(&local_1e8,this);
  FIX41::OrderCancelRequest::set(__return_storage_ptr__,&local_1e8);
  FIX::OrderQty::~OrderQty(&local_1e8);
  header = FIX41::Message::getHeader(&__return_storage_ptr__->super_Message);
  queryHeader(this,(Header *)header);
  return __return_storage_ptr__;
}

Assistant:

FIX41::OrderCancelRequest Application::queryOrderCancelRequest41() {
  FIX41::OrderCancelRequest orderCancelRequest(queryOrigClOrdID(), queryClOrdID(), querySymbol(), querySide());

  orderCancelRequest.set(queryOrderQty());
  queryHeader(orderCancelRequest.getHeader());
  return orderCancelRequest;
}